

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::ComplainAboutMissingTarget
          (cmExportBuildFileGenerator *this,cmGeneratorTarget *depender,cmGeneratorTarget *dependee,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *exportFiles)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  cmGlobalGenerator *this_00;
  cmake *this_01;
  undefined1 local_200 [16];
  string local_1f0;
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *exportFiles_local;
  cmGeneratorTarget *dependee_local;
  cmGeneratorTarget *depender_local;
  cmExportBuildFileGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,"export called with target \"");
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,"\" which requires target \"");
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::operator<<(poVar2,"\" ");
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(exportFiles);
  if (bVar1) {
    std::operator<<((ostream *)local_1a0,"that is not in any export set.");
  }
  else {
    poVar2 = std::operator<<((ostream *)local_1a0,
                             "that is not in this export set, but in multiple other export sets: ");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)(local_200 + 0x30),exportFiles,", ");
    poVar2 = std::operator<<(poVar2,(string *)(local_200 + 0x30));
    std::operator<<(poVar2,".\n");
    std::__cxx11::string::~string((string *)(local_200 + 0x30));
    poVar2 = std::operator<<((ostream *)local_1a0,
                             "An exported target cannot depend upon another target which is exported multiple times. Consider consolidating the exports of the \""
                            );
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,"\" target to a single export.");
  }
  this_00 = cmLocalGenerator::GetGlobalGenerator(this->LG);
  this_01 = cmGlobalGenerator::GetCMakeInstance(this_00);
  std::__cxx11::ostringstream::str();
  cmLocalGenerator::GetMakefile(this->LG);
  cmMakefile::GetBacktrace((cmMakefile *)local_200);
  cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_200 + 0x10),
                      (cmListFileBacktrace *)local_200);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_200);
  std::__cxx11::string::~string((string *)(local_200 + 0x10));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

void cmExportBuildFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget* depender, cmGeneratorTarget* dependee,
  std::vector<std::string> const& exportFiles)
{
  std::ostringstream e;
  e << "export called with target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (exportFiles.empty()) {
    e << "that is not in any export set.";
  } else {
    e << "that is not in this export set, but in multiple other export sets: "
      << cmJoin(exportFiles, ", ") << ".\n";
    e << "An exported target cannot depend upon another target which is "
         "exported multiple times. Consider consolidating the exports of the "
         "\""
      << dependee->GetName() << "\" target to a single export.";
  }

  this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, e.str(),
    this->LG->GetMakefile()->GetBacktrace());
}